

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op<ncnn::binary_op_add>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  float fVar4;
  int i_14;
  int i_13;
  float b0_7;
  int x_7;
  float a0_7;
  int y_7;
  float *outptr_16;
  float *ptr1_12;
  int i_12;
  float *outptr_15;
  float *ptr1_11;
  float a0_6;
  int q_14;
  int i_11;
  float a0_5;
  int i_10;
  float a0_4;
  int i_9;
  float *outptr_14;
  float *ptr1_10;
  int q_13;
  float a0_3;
  int x_6;
  float b0_6;
  int y_6;
  float *outptr_13;
  float *ptr_12;
  int i_8;
  float b0_5;
  int i_7;
  int x_5;
  float a0_2;
  int y_5;
  float *outptr_12;
  float *ptr1_9;
  float *ptr_11;
  int q_12;
  int i_6;
  float *outptr_11;
  float b0_4;
  float *ptr_10;
  int q_11;
  int i_5;
  float *outptr_10;
  float *ptr_9;
  int q_10;
  float b0_3;
  int x_4;
  float b0_2;
  int y_4;
  float *outptr_9;
  float *ptr1_8;
  float *ptr_8;
  int q_9;
  int i_4;
  float *outptr_8;
  float *ptr1_7;
  float *ptr_7;
  int q_8;
  int x_3;
  int y_3;
  float *outptr_7;
  float *ptr1_6;
  float *ptr_6;
  int q_7;
  int x_2;
  float a0_1;
  int y_2;
  float *outptr_6;
  float *ptr1_5;
  float *ptr_5;
  int q_6;
  int x_1;
  int y_1;
  float *outptr_5;
  float *ptr1_4;
  float *ptr_4;
  int q_5;
  int x;
  float b0_1;
  int y;
  float *outptr_4;
  float *ptr1_3;
  float *ptr_3;
  int q_4;
  int i_3;
  float *outptr_3;
  float *ptr1_2;
  float *ptr_2;
  int q_3;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *a0;
  int q_2;
  int i_1;
  float *outptr_1;
  float *ptr1;
  float *ptr_1;
  int q_1;
  int i;
  float *outptr;
  float *b0;
  float *ptr;
  int q;
  int size1;
  int channels1;
  int h1;
  int w1;
  size_t elemsize;
  int size;
  int channels;
  int h;
  int w;
  binary_op_add op;
  undefined4 in_stack_fffffffffffff040;
  undefined4 in_stack_fffffffffffff044;
  Allocator *in_stack_fffffffffffff048;
  Mat *pMVar5;
  size_t in_stack_fffffffffffff050;
  int iVar6;
  int _h;
  undefined8 in_stack_fffffffffffff058;
  int _w;
  Mat *in_stack_fffffffffffff060;
  undefined4 in_stack_fffffffffffff068;
  undefined4 in_stack_fffffffffffff06c;
  int local_d48;
  int local_d44;
  float local_d40;
  int local_d3c;
  float local_d38;
  int local_d34;
  float *local_d30;
  float *local_d28;
  int local_d1c;
  Mat local_d18;
  float *local_cd0;
  Mat local_cc8;
  Mat *local_c80;
  float local_c74;
  int local_c70;
  int local_c6c;
  float local_c68;
  int local_c64;
  float local_c60;
  int local_c5c;
  Mat local_c58;
  float *local_c10;
  Mat local_c08;
  float *local_bc0;
  int local_bb4;
  float local_bb0;
  int local_bac;
  float local_ba8;
  int local_ba4;
  float *local_ba0;
  float *local_b98;
  int local_b90;
  float local_b8c;
  int local_b88;
  int local_b84;
  float local_b80;
  int local_b7c;
  Mat local_b78;
  float *local_b30;
  Mat local_b28;
  float *local_ae0;
  float *local_ad8;
  int local_ad0;
  int local_acc;
  Mat local_ac8;
  float *local_a80;
  float local_a74;
  Mat local_a70;
  float *local_a28;
  int local_a20;
  int local_a1c;
  Mat local_a18;
  float *local_9d0;
  Mat local_9c8;
  float *local_980;
  int local_974;
  float local_970;
  int local_96c;
  float local_968;
  int local_964;
  Mat local_960;
  float *local_918;
  float *local_910;
  Mat local_908;
  float *local_8c0;
  int local_8b8;
  int local_8b4;
  Mat local_8b0;
  float *local_868;
  Mat local_860;
  float *local_818;
  Mat local_810;
  float *local_7c8;
  int local_7bc;
  int local_7b8;
  int local_7b4;
  Mat local_7b0;
  float *local_768;
  Mat local_760;
  float *local_718;
  Mat local_710;
  float *local_6c8;
  int local_6c0;
  int local_6bc;
  float local_6b8;
  int local_6b4;
  Mat local_6b0;
  float *local_668;
  Mat local_660;
  float *local_618;
  Mat local_610;
  float *local_5c8;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  Mat local_5b0;
  float *local_568;
  Mat local_560;
  float *local_518;
  Mat local_510;
  float *local_4c8;
  int local_4c0;
  int local_4bc;
  float local_4b8;
  int local_4b4;
  Mat local_4b0;
  float *local_468;
  Mat local_460;
  float *local_418;
  Mat local_410;
  float *local_3c8;
  int local_3c0;
  int local_3bc;
  Mat local_3b8;
  float *local_370;
  Mat local_368;
  float *local_320;
  float *local_318;
  int local_310;
  int local_30c;
  Mat local_308;
  float *local_2c0;
  Mat local_2b8;
  float *local_270;
  Mat local_268;
  float *local_220;
  int local_218;
  int local_214;
  Mat local_210;
  float *local_1c8;
  float *local_1c0;
  Mat local_1b8;
  float *local_170;
  int local_168;
  int local_164;
  Mat local_160;
  float *local_118;
  Mat local_110;
  float *local_c8;
  Mat local_b0;
  float *local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  size_t local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  binary_op_add local_29 [9];
  Mat *local_20;
  Mat *local_18;
  Mat *local_10;
  
  local_30 = in_RDI->w;
  local_34 = in_RDI->h;
  local_38 = in_RDI->c;
  local_3c = local_30 * local_34;
  local_48 = in_RDI->elemsize;
  local_4c = in_RSI->w;
  local_50 = in_RSI->h;
  local_54 = in_RSI->c;
  local_58 = local_4c * local_50;
  iVar6 = (int)(in_stack_fffffffffffff050 >> 0x20);
  _h = (int)in_stack_fffffffffffff058;
  _w = (int)((ulong)in_stack_fffffffffffff058 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDI->dims == 3) {
    if (in_RSI->dims == 3) {
      if (((local_4c == 1) && (local_50 == 1)) && (local_54 == local_38)) {
        Mat::create(in_stack_fffffffffffff060,_w,_h,iVar6,(size_t)in_stack_fffffffffffff048,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        if (!bVar1) {
          for (local_5c = 0; local_5c < local_38; local_5c = local_5c + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_b0);
            Mat::~Mat((Mat *)0x542527);
            local_68 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_110);
            Mat::~Mat((Mat *)0x54257f);
            local_c8 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_160);
            Mat::~Mat((Mat *)0x5425d7);
            local_118 = pfVar2;
            for (local_164 = 0; local_164 < local_3c; local_164 = local_164 + 1) {
              fVar4 = binary_op_add::operator()(local_29,local_68 + local_164,local_c8);
              local_118[local_164] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_4c == local_30) && (local_50 == local_34)) && (local_54 == 1)) {
        Mat::create(in_stack_fffffffffffff060,_w,_h,iVar6,(size_t)in_stack_fffffffffffff048,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        if (!bVar1) {
          for (local_168 = 0; local_168 < local_38; local_168 = local_168 + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_1b8);
            Mat::~Mat((Mat *)0x5427ea);
            local_170 = pfVar2;
            local_1c0 = Mat::operator_cast_to_float_(local_18);
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_210);
            Mat::~Mat((Mat *)0x542857);
            local_1c8 = pfVar2;
            for (local_214 = 0; local_214 < local_3c; local_214 = local_214 + 1) {
              fVar4 = binary_op_add::operator()
                                (local_29,local_170 + local_214,local_1c0 + local_214);
              local_1c8[local_214] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_30 == 1) && (local_34 == 1)) && (local_54 == local_38)) {
        Mat::create(in_stack_fffffffffffff060,_w,_h,iVar6,(size_t)in_stack_fffffffffffff048,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        if (!bVar1) {
          for (local_218 = 0; local_218 < local_54; local_218 = local_218 + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_268);
            Mat::~Mat((Mat *)0x542a4d);
            local_220 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_2b8);
            Mat::~Mat((Mat *)0x542aa5);
            local_270 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_308);
            Mat::~Mat((Mat *)0x542afd);
            local_2c0 = pfVar2;
            for (local_30c = 0; local_30c < local_58; local_30c = local_30c + 1) {
              fVar4 = binary_op_add::operator()(local_29,local_220,local_270 + local_30c);
              local_2c0[local_30c] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_4c == local_30) && (local_50 == local_34)) && (local_38 == 1)) {
        Mat::create(in_stack_fffffffffffff060,_w,_h,iVar6,(size_t)in_stack_fffffffffffff048,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        if (!bVar1) {
          for (local_310 = 0; local_310 < local_54; local_310 = local_310 + 1) {
            local_318 = Mat::operator_cast_to_float_(local_10);
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_368);
            Mat::~Mat((Mat *)0x542d25);
            local_320 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_3b8);
            Mat::~Mat((Mat *)0x542d7d);
            local_370 = pfVar2;
            for (local_3bc = 0; local_3bc < local_58; local_3bc = local_3bc + 1) {
              fVar4 = binary_op_add::operator()
                                (local_29,local_318 + local_3bc,local_320 + local_3bc);
              local_370[local_3bc] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_30 != 1) && (local_4c == 1)) && ((local_50 == local_34 && (local_54 == local_38)))
         ) {
        Mat::create(in_stack_fffffffffffff060,_w,_h,iVar6,(size_t)in_stack_fffffffffffff048,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        if (!bVar1) {
          for (local_3c0 = 0; local_3c0 < local_54; local_3c0 = local_3c0 + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_410);
            Mat::~Mat((Mat *)0x542f87);
            local_3c8 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_460);
            Mat::~Mat((Mat *)0x542fdf);
            local_418 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_4b0);
            Mat::~Mat((Mat *)0x543037);
            local_468 = pfVar2;
            for (local_4b4 = 0; local_4b4 < local_34; local_4b4 = local_4b4 + 1) {
              local_4b8 = local_418[local_4b4];
              for (local_4bc = 0; local_4bc < local_30; local_4bc = local_4bc + 1) {
                fVar4 = binary_op_add::operator()(local_29,local_3c8 + local_4bc,&local_4b8);
                local_468[local_4bc] = fVar4;
              }
              local_3c8 = local_3c8 + local_30;
              local_468 = local_468 + local_30;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((local_4c == local_30) && (local_34 != 1)) && (local_50 == 1)) && (local_54 == local_38)
         ) {
        Mat::create(in_stack_fffffffffffff060,_w,_h,iVar6,(size_t)in_stack_fffffffffffff048,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        if (!bVar1) {
          for (local_4c0 = 0; local_4c0 < local_54; local_4c0 = local_4c0 + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_510);
            Mat::~Mat((Mat *)0x5432ed);
            local_4c8 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_560);
            Mat::~Mat((Mat *)0x543345);
            local_518 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_5b0);
            Mat::~Mat((Mat *)0x54339d);
            local_568 = pfVar2;
            for (local_5b4 = 0; local_5b4 < local_34; local_5b4 = local_5b4 + 1) {
              for (local_5b8 = 0; local_5b8 < local_30; local_5b8 = local_5b8 + 1) {
                fVar4 = binary_op_add::operator()
                                  (local_29,local_4c8 + local_5b8,local_518 + local_5b8);
                local_568[local_5b8] = fVar4;
              }
              local_4c8 = local_4c8 + local_30;
              local_568 = local_568 + local_30;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((local_4c != 1) && (local_30 == 1)) && (local_50 == local_34)) && (local_54 == local_38)
         ) {
        Mat::create(in_stack_fffffffffffff060,_w,_h,iVar6,(size_t)in_stack_fffffffffffff048,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        if (!bVar1) {
          for (local_5bc = 0; local_5bc < local_54; local_5bc = local_5bc + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_610);
            Mat::~Mat((Mat *)0x543644);
            local_5c8 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_660);
            Mat::~Mat((Mat *)0x54369c);
            local_618 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_6b0);
            Mat::~Mat((Mat *)0x5436f4);
            local_668 = pfVar2;
            for (local_6b4 = 0; local_6b4 < local_50; local_6b4 = local_6b4 + 1) {
              local_6b8 = local_5c8[local_6b4];
              for (local_6bc = 0; local_6bc < local_4c; local_6bc = local_6bc + 1) {
                fVar4 = binary_op_add::operator()(local_29,&local_6b8,local_618 + local_6bc);
                local_668[local_6bc] = fVar4;
              }
              local_618 = local_618 + local_4c;
              local_668 = local_668 + local_4c;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_4c == local_30) && (local_50 != 1)) && ((local_34 == 1 && (local_54 == local_38)))
         ) {
        Mat::create(in_stack_fffffffffffff060,_w,_h,iVar6,(size_t)in_stack_fffffffffffff048,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        if (!bVar1) {
          for (local_6c0 = 0; local_6c0 < local_54; local_6c0 = local_6c0 + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_710);
            Mat::~Mat((Mat *)0x5439aa);
            local_6c8 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_760);
            Mat::~Mat((Mat *)0x543a02);
            local_718 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_7b0);
            Mat::~Mat((Mat *)0x543a5a);
            local_768 = pfVar2;
            for (local_7b4 = 0; local_7b4 < local_50; local_7b4 = local_7b4 + 1) {
              for (local_7b8 = 0; local_7b8 < local_4c; local_7b8 = local_7b8 + 1) {
                fVar4 = binary_op_add::operator()
                                  (local_29,local_6c8 + local_7b8,local_718 + local_7b8);
                local_768[local_7b8] = fVar4;
              }
              local_718 = local_718 + local_4c;
              local_768 = local_768 + local_4c;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(in_stack_fffffffffffff060,_w,_h,iVar6,(size_t)in_stack_fffffffffffff048,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
      bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
      if (!bVar1) {
        for (local_7bc = 0; local_7bc < local_38; local_7bc = local_7bc + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                       (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_810);
          Mat::~Mat((Mat *)0x543cbd);
          local_7c8 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                       (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_860);
          Mat::~Mat((Mat *)0x543d15);
          local_818 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                       (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_8b0);
          Mat::~Mat((Mat *)0x543d6d);
          local_868 = pfVar2;
          for (local_8b4 = 0; local_8b4 < local_3c; local_8b4 = local_8b4 + 1) {
            fVar4 = binary_op_add::operator()(local_29,local_7c8 + local_8b4,local_818 + local_8b4);
            local_868[local_8b4] = fVar4;
          }
        }
        return 0;
      }
      return -100;
    }
    Mat::create(in_stack_fffffffffffff060,_w,_h,iVar6,(size_t)in_stack_fffffffffffff048,
                (Allocator *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
    if (bVar1) {
      return -100;
    }
    if (local_18->dims == 2) {
      for (local_8b8 = 0; local_8b8 < local_38; local_8b8 = local_8b8 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                     (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_908);
        Mat::~Mat((Mat *)0x543f6b);
        local_8c0 = pfVar2;
        local_910 = Mat::row(local_18,local_8b8);
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                     (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_960);
        Mat::~Mat((Mat *)0x543fdf);
        local_918 = pfVar2;
        for (local_964 = 0; local_964 < local_34; local_964 = local_964 + 1) {
          local_968 = local_910[local_964];
          for (local_96c = 0; local_96c < local_30; local_96c = local_96c + 1) {
            fVar4 = binary_op_add::operator()(local_29,local_8c0 + local_96c,&local_968);
            local_918[local_96c] = fVar4;
          }
          local_8c0 = local_8c0 + local_30;
          local_918 = local_918 + local_30;
        }
      }
      return 0;
    }
    if (local_18->dims == 1) {
      if (local_18->w == 1) {
        pfVar2 = Mat::operator[](local_18,0);
        local_970 = *pfVar2;
        for (local_974 = 0; local_974 < local_38; local_974 = local_974 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                       (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_9c8);
          Mat::~Mat((Mat *)0x544214);
          local_980 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                       (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_a18);
          Mat::~Mat((Mat *)0x54426c);
          local_9d0 = pfVar2;
          for (local_a1c = 0; local_a1c < local_3c; local_a1c = local_a1c + 1) {
            fVar4 = binary_op_add::operator()(local_29,local_980 + local_a1c,&local_970);
            local_9d0[local_a1c] = fVar4;
          }
        }
        return 0;
      }
      for (local_a20 = 0; local_a20 < local_38; local_a20 = local_a20 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                     (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_a70);
        Mat::~Mat((Mat *)0x5443ca);
        local_a28 = pfVar2;
        pfVar2 = Mat::operator[](local_18,(long)local_a20);
        local_a74 = *pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                     (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_ac8);
        Mat::~Mat((Mat *)0x544444);
        local_a80 = pfVar2;
        for (local_acc = 0; local_acc < local_3c; local_acc = local_acc + 1) {
          fVar4 = binary_op_add::operator()(local_29,local_a28 + local_acc,&local_a74);
          local_a80[local_acc] = fVar4;
        }
      }
      return 0;
    }
  }
  else {
    local_20 = in_RDX;
    if (in_RDI->dims == 2) {
      if (in_RSI->dims == 3) {
        Mat::create(in_stack_fffffffffffff060,_w,_h,iVar6,(size_t)in_stack_fffffffffffff048,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        if (!bVar1) {
          for (local_ad0 = 0; local_ad0 < local_54; local_ad0 = local_ad0 + 1) {
            local_ad8 = Mat::row(local_10,local_ad0);
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_b28);
            Mat::~Mat((Mat *)0x544640);
            local_ae0 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_b78);
            Mat::~Mat((Mat *)0x54468f);
            local_b30 = pfVar2;
            for (local_b7c = 0; local_b7c < local_50; local_b7c = local_b7c + 1) {
              local_b80 = local_ad8[local_b7c];
              for (local_b84 = 0; local_b84 < local_4c; local_b84 = local_b84 + 1) {
                fVar4 = binary_op_add::operator()(local_29,&local_b80,local_ae0 + local_b84);
                local_b30[local_b84] = fVar4;
              }
              local_ae0 = local_ae0 + local_4c;
              local_b30 = local_b30 + local_4c;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(in_stack_fffffffffffff060,_w,_h,in_stack_fffffffffffff050,
                  in_stack_fffffffffffff048);
      bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
      if (bVar1) {
        return -100;
      }
      if (local_18->dims == 2) {
        for (local_b88 = 0; local_b88 < local_3c; local_b88 = local_b88 + 1) {
          pfVar2 = Mat::operator[](local_10,(long)local_b88);
          pfVar3 = Mat::operator[](local_18,(long)local_b88);
          fVar4 = binary_op_add::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,(long)local_b88);
          *pfVar2 = fVar4;
        }
        return 0;
      }
      if (local_18->dims == 1) {
        Mat::create(in_stack_fffffffffffff060,(int)((ulong)in_stack_fffffffffffff058 >> 0x20),
                    (int)in_stack_fffffffffffff058,in_stack_fffffffffffff050,
                    in_stack_fffffffffffff048);
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_b8c = *pfVar2;
          for (local_b90 = 0; local_b90 < local_3c; local_b90 = local_b90 + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_b90);
            fVar4 = binary_op_add::operator()(local_29,pfVar2,&local_b8c);
            pfVar2 = Mat::operator[](local_20,(long)local_b90);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        local_b98 = Mat::operator_cast_to_float_(local_10);
        local_ba0 = Mat::operator_cast_to_float_(local_20);
        for (local_ba4 = 0; local_ba4 < local_34; local_ba4 = local_ba4 + 1) {
          pfVar2 = Mat::operator[](local_18,(long)local_ba4);
          local_ba8 = *pfVar2;
          for (local_bac = 0; local_bac < local_30; local_bac = local_bac + 1) {
            fVar4 = binary_op_add::operator()(local_29,local_b98 + local_bac,&local_ba8);
            local_ba0[local_bac] = fVar4;
          }
          local_b98 = local_b98 + local_30;
          local_ba0 = local_ba0 + local_30;
        }
        return 0;
      }
    }
    else if (in_RDI->dims == 1) {
      if (in_RDI->w == 1) {
        if (in_RSI->dims == 3) {
          Mat::create(in_stack_fffffffffffff060,_w,_h,iVar6,(size_t)in_stack_fffffffffffff048,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
          bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_bb0 = *pfVar2;
            for (local_bb4 = 0; local_bb4 < local_54; local_bb4 = local_bb4 + 1) {
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                           (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_c08);
              Mat::~Mat((Mat *)0x544c9c);
              local_bc0 = pfVar2;
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                           (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_c58);
              Mat::~Mat((Mat *)0x544ce8);
              local_c10 = pfVar2;
              for (local_c5c = 0; local_c5c < local_58; local_c5c = local_c5c + 1) {
                fVar4 = binary_op_add::operator()(local_29,&local_bb0,local_bc0 + local_c5c);
                local_c10[local_c5c] = fVar4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 2) {
          Mat::create(in_stack_fffffffffffff060,_w,_h,in_stack_fffffffffffff050,
                      in_stack_fffffffffffff048);
          bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_c60 = *pfVar2;
            for (local_c64 = 0; local_c64 < local_58; local_c64 = local_c64 + 1) {
              pfVar2 = Mat::operator[](local_18,(long)local_c64);
              fVar4 = binary_op_add::operator()(local_29,&local_c60,pfVar2);
              pfVar2 = Mat::operator[](local_20,(long)local_c64);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 1) {
          Mat::create(in_stack_fffffffffffff060,_w,in_stack_fffffffffffff050,
                      in_stack_fffffffffffff048);
          bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_c68 = *pfVar2;
            for (local_c6c = 0; local_c6c < local_4c; local_c6c = local_c6c + 1) {
              pfVar2 = Mat::operator[](local_18,(long)local_c6c);
              fVar4 = binary_op_add::operator()(local_29,&local_c68,pfVar2);
              pfVar2 = Mat::operator[](local_20,(long)local_c6c);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
      }
      if (in_RSI->dims == 3) {
        Mat::create(in_stack_fffffffffffff060,_w,_h,iVar6,(size_t)in_stack_fffffffffffff048,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        if (!bVar1) {
          for (local_c70 = 0; iVar6 = (int)((ulong)in_stack_fffffffffffff060 >> 0x20),
              local_c70 < local_54; local_c70 = local_c70 + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_c70);
            local_c74 = *pfVar2;
            pMVar5 = &local_cc8;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),iVar6)
            ;
            in_stack_fffffffffffff060 = (Mat *)Mat::operator_cast_to_float_(pMVar5);
            Mat::~Mat((Mat *)0x5450e6);
            pMVar5 = &local_d18;
            local_c80 = in_stack_fffffffffffff060;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                         (int)((ulong)in_stack_fffffffffffff060 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(pMVar5);
            Mat::~Mat((Mat *)0x545132);
            local_cd0 = pfVar2;
            for (local_d1c = 0; local_d1c < local_58; local_d1c = local_d1c + 1) {
              fVar4 = binary_op_add::operator()
                                (local_29,&local_c74,
                                 (float *)((long)&local_c80->data + (long)local_d1c * 4));
              local_cd0[local_d1c] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 2) {
        Mat::create(in_stack_fffffffffffff060,_w,_h,in_stack_fffffffffffff050,
                    in_stack_fffffffffffff048);
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        if (!bVar1) {
          local_d28 = Mat::operator_cast_to_float_(local_18);
          local_d30 = Mat::operator_cast_to_float_(local_20);
          for (local_d34 = 0; local_d34 < local_50; local_d34 = local_d34 + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_d34);
            local_d38 = *pfVar2;
            for (local_d3c = 0; local_d3c < local_4c; local_d3c = local_d3c + 1) {
              fVar4 = binary_op_add::operator()(local_29,&local_d38,local_d28 + local_d3c);
              local_d30[local_d3c] = fVar4;
            }
            local_d28 = local_d28 + local_4c;
            local_d30 = local_d30 + local_4c;
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 1) {
        Mat::create(in_stack_fffffffffffff060,_w,in_stack_fffffffffffff050,in_stack_fffffffffffff048
                   );
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_d40 = *pfVar2;
          for (local_d44 = 0; local_d44 < local_30; local_d44 = local_d44 + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_d44);
            fVar4 = binary_op_add::operator()(local_29,pfVar2,&local_d40);
            pfVar2 = Mat::operator[](local_20,(long)local_d44);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        for (local_d48 = 0; local_d48 < local_30; local_d48 = local_d48 + 1) {
          pfVar2 = Mat::operator[](local_10,(long)local_d48);
          pfVar3 = Mat::operator[](local_18,(long)local_d48);
          fVar4 = binary_op_add::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,(long)local_d48);
          *pfVar2 = fVar4;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;
    size_t elemsize = a.elemsize;

    int w1 = b.w;
    int h1 = b.h;
    int channels1 = b.c;
    int size1 = w1 * h1;

    if (a.dims == 3)
    {
        if (b.dims == 3)
        {
            if (w1 == 1 && h1 == 1 && channels1 == channels)
            {
                // special type 1
                c.create(w, h, channels, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* b0 = b.channel(q);
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], b0[0]);
                    }
                }

                return 0;
            }

            if (w1 == w && h1 == h && channels1 == 1)
            {
                // special type 2
                c.create(w, h, channels, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* ptr1 = b;
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], ptr1[i]);
                    }
                }

                return 0;
            }

            if (w == 1 && h == 1 && channels1 == channels)
            {
                // special type 3
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* a0 = a.channel(q);
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size1; i++)
                    {
                        outptr[i] = op(a0[0], ptr1[i]);
                    }
                }

                return 0;
            }

            if (w1 == w && h1 == h && channels == 1)
            {
                // special type 4
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr = a;
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size1; i++)
                    {
                        outptr[i] = op(ptr[i], ptr1[i]);
                    }
                }

                return 0;
            }

            if (w != 1 && w1 == 1 && h1 == h && channels1 == channels)
            {
                // special type 5
                c.create(w, h, channels, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int y = 0; y < h; y++)
                    {
                        const float b0 = ptr1[y];
                        for (int x = 0; x < w; x++)
                        {
                            outptr[x] = op(ptr[x], b0);
                        }

                        ptr += w;
                        outptr += w;
                    }
                }

                return 0;
            }

            if (w1 == w && h != 1 && h1 == 1 && channels1 == channels)
            {
                // special type 6
                c.create(w, h, channels, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int y = 0; y < h; y++)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            outptr[x] = op(ptr[x], ptr1[x]);
                        }

                        ptr += w;
                        outptr += w;
                    }
                }

                return 0;
            }

            if (w1 != 1 && w == 1 && h1 == h && channels1 == channels)
            {
                // special type 7
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int y = 0; y < h1; y++)
                    {
                        const float a0 = ptr[y];
                        for (int x = 0; x < w1; x++)
                        {
                            outptr[x] = op(a0, ptr1[x]);
                        }

                        ptr1 += w1;
                        outptr += w1;
                    }
                }

                return 0;
            }

            if (w1 == w && h1 != 1 && h == 1 && channels1 == channels)
            {
                // special type 8
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int y = 0; y < h1; y++)
                    {
                        for (int x = 0; x < w1; x++)
                        {
                            outptr[x] = op(ptr[x], ptr1[x]);
                        }

                        ptr1 += w1;
                        outptr += w1;
                    }
                }

                return 0;
            }

            // type 19
            c.create(w, h, channels, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = op(ptr[i], ptr1[i]);
                }
            }

            return 0;
        }

        c.create(w, h, channels, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 2)
        {
            // type 18
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.row(q);
                float* outptr = c.channel(q);

                for (int y = 0; y < h; y++)
                {
                    const float b0 = ptr1[y];
                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(ptr[x], b0);
                    }

                    ptr += w;
                    outptr += w;
                }
            }

            return 0;
        }

        if (b.dims == 1)
        {
            if (b.w == 1)
            {
                // type 16
                const float b0 = b[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    float* outptr = c.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], b0);
                    }
                }

                return 0;
            }

            // type 17
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                const float b0 = b[q];
                float* outptr = c.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = op(ptr[i], b0);
                }
            }

            return 0;
        }
    }
    else if (a.dims == 2)
    {
        if (b.dims == 3)
        {
            // type 14
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels1; q++)
            {
                const float* ptr = a.row(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int y = 0; y < h1; y++)
                {
                    const float a0 = ptr[y];
                    for (int x = 0; x < w1; x++)
                    {
                        outptr[x] = op(a0, ptr1[x]);
                    }

                    ptr1 += w1;
                    outptr += w1;
                }
            }

            return 0;
        }

        c.create(w, h, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 2)
        {
            // type 13
            for (int i = 0; i < size; i++)
            {
                c[i] = op(a[i], b[i]);
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, h, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                // type 11
                const float b0 = b[0];
                for (int i = 0; i < size; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            // type 12
            const float* ptr = a;
            float* outptr = c;

            for (int y = 0; y < h; y++)
            {
                const float b0 = b[y];
                for (int x = 0; x < w; x++)
                {
                    outptr[x] = op(ptr[x], b0);
                }

                ptr += w;
                outptr += w;
            }

            return 0;
        }
    }
    else if (a.dims == 1)
    {
        if (a.w == 1)
        {
            if (b.dims == 3)
            {
                // type 4
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int i = 0; i < size1; i++)
                    {
                        outptr[i] = op(a0, ptr1[i]);
                    }
                }

                return 0;
            }

            if (b.dims == 2)
            {
                // type 3
                c.create(w1, h1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i = 0; i < size1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }

            if (b.dims == 1)
            {
                // type 2
                c.create(w1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i = 0; i < w1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }
        }

        if (b.dims == 3)
        {
            // type 9
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels1; q++)
            {
                const float a0 = a[q];
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i = 0; i < size1; i++)
                {
                    outptr[i] = op(a0, ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            // type 8
            c.create(w1, h1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            const float* ptr1 = b;
            float* outptr = c;

            for (int y = 0; y < h1; y++)
            {
                const float a0 = a[y];
                for (int x = 0; x < w1; x++)
                {
                    outptr[x] = op(a0, ptr1[x]);
                }

                ptr1 += w1;
                outptr += w1;
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                // type 6
                const float b0 = b[0];
                for (int i = 0; i < w; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            // type 7
            for (int i = 0; i < w; i++)
            {
                c[i] = op(a[i], b[i]);
            }
        }
    }

    return 0;
}